

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

int __thiscall trun::Process_Unix::ConsumePipes(Process_Unix *this,ProcessCallbackBase *callback)

{
  int iVar1;
  ssize_t sVar2;
  string *this_00;
  initializer_list<pollfd> __l;
  allocator_type local_a1;
  string buffer;
  vector<pollfd,_std::allocator<pollfd>_> plist;
  string local_68 [32];
  string local_48 [32];
  pollfd local_28;
  int local_20;
  undefined4 local_1c;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&buffer,0x400,' ');
  local_28.fd = this->pipe_stdout[0];
  local_28.events = 1;
  local_28.revents = 0;
  local_20 = this->pipe_stderr[0];
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_1c = local_28._4_4_;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&plist,__l,&local_a1);
  iVar1 = poll((pollfd *)
               plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,0);
  if (((plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
       _M_start)->revents & 1) == 0) {
    if ((plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
         _M_start[1].revents & 1) == 0) goto LAB_00128a63;
    sVar2 = read(this->pipe_stderr[0],buffer._M_dataplus._M_p,buffer._M_string_length);
    buffer._M_dataplus._M_p[(int)sVar2] = '\0';
    this_00 = local_68;
    std::__cxx11::string::string(this_00,&buffer);
    (*(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[3])
              (callback,this_00);
  }
  else {
    sVar2 = read(this->pipe_stdout[0],buffer._M_dataplus._M_p,buffer._M_string_length);
    buffer._M_dataplus._M_p[(int)sVar2] = '\0';
    this_00 = local_48;
    std::__cxx11::string::string(this_00,&buffer);
    (*(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[2])
              (callback,this_00);
  }
  std::__cxx11::string::~string(this_00);
LAB_00128a63:
  std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
            (&plist.super__Vector_base<pollfd,_std::allocator<pollfd>_>);
  std::__cxx11::string::~string((string *)&buffer);
  return iVar1;
}

Assistant:

int Process_Unix::ConsumePipes(ProcessCallbackBase *callback) {

	std::string buffer(1024,' ');
	std::vector<pollfd> plist = { {pipe_stdout[0],POLLIN, 0}, {pipe_stderr[0],POLLIN, 0} };
	int rval=poll(&plist[0],plist.size(),/*timeout*/0);
    if ( plist[0].revents&POLLIN) {
      int bytes_read = read(pipe_stdout[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stdout.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdOutData(buffer);
    }
    else if ( plist[1].revents&POLLIN ) {
      int bytes_read = read(pipe_stderr[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stderr.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdErrData(buffer);
    }
	return rval;

}